

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ReduceL1LayerParams::_InternalParse
          (ReduceL1LayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  uint64_t value;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_38;
      uVar6 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar6);
          p = (byte *)pVar7.first;
          uVar6 = pVar7.second;
        }
        else {
          p = local_38 + 2;
        }
      }
      uVar3 = uVar6 >> 3;
      cVar5 = (char)uVar6;
      local_38 = p;
      if (uVar3 == 3) {
        if (cVar5 != '\x18') goto LAB_00290c4c;
        uVar4 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar4 < 0) {
          uVar6 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
            local_38 = (byte *)pVar8.first;
            this->reduceall_ = pVar8.second != 0;
            goto joined_r0x00290c48;
          }
          uVar4 = (ulong)uVar6;
          local_38 = p + 2;
        }
        this->reduceall_ = uVar4 != 0;
      }
      else {
        if (uVar3 == 2) {
          if (cVar5 == '\x10') {
            uVar4 = (ulong)(char)*p;
            local_38 = p + 1;
            if ((long)uVar4 < 0) {
              uVar6 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
              if ((char)*local_38 < '\0') {
                local_38 = p;
                pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
                local_38 = (byte *)pVar8.first;
                this->keepdims_ = pVar8.second != 0;
                goto joined_r0x00290c48;
              }
              uVar4 = (ulong)uVar6;
              local_38 = p + 2;
            }
            this->keepdims_ = uVar4 != 0;
            goto LAB_00290c82;
          }
LAB_00290c4c:
          if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
            if (p == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
            return (char *)p;
          }
          uVar4 = this_00->ptr_;
          if ((uVar4 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar4 & 0xfffffffffffffffc) + 8);
          }
          local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar6,unknown,(char *)local_38,ctx);
        }
        else {
          if (uVar3 != 1) goto LAB_00290c4c;
          if (cVar5 == '\n') {
            local_38 = (byte *)google::protobuf::internal::PackedInt64Parser
                                         (&this->axes_,(char *)p,ctx);
          }
          else {
            if ((uVar6 & 0xff) != 8) goto LAB_00290c4c;
            value = google::protobuf::internal::ReadVarint64((char **)&local_38);
            _internal_add_axes(this,value);
          }
        }
joined_r0x00290c48:
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
LAB_00290c82:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_38;
}

Assistant:

const char* ReduceL1LayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated int64 axes = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt64Parser(_internal_mutable_axes(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_axes(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool keepDims = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          keepdims_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool reduceAll = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          reduceall_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}